

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int CheckMask(int c,char *zMask,int nMasklen,int *pOfft)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(uint)nMasklen;
  if (nMasklen < 1) {
    uVar1 = 0;
  }
  uVar2 = 0;
  while( true ) {
    if (uVar1 == uVar2) {
      return 0;
    }
    if (zMask[uVar2] == c) break;
    uVar2 = uVar2 + 1;
  }
  if (pOfft == (int *)0x0) {
    return 1;
  }
  *pOfft = (int)uVar2;
  return 1;
}

Assistant:

static int CheckMask(int c, const char *zMask, int nMasklen, int *pOfft)
{
	int i;
	for( i = 0 ; i < nMasklen ; ++i ){
		if( c == zMask[i] ){
			if( pOfft ){
				*pOfft = i;
			}
			return TRUE;
		}
	}
	return FALSE;
}